

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O1

void __thiscall
glslang::TBuiltInParseablesHlsl::identifyBuiltIns
          (TBuiltInParseablesHlsl *this,int param_1,EProfile param_2,SpvVersion *param_3,
          EShLanguage param_4,TSymbolTable *symbolTable)

{
  TSymbolTable::relateToOperator(symbolTable,"abs",EOpAbs);
  TSymbolTable::relateToOperator(symbolTable,"acos",EOpAcos);
  TSymbolTable::relateToOperator(symbolTable,"all",EOpAll);
  TSymbolTable::relateToOperator(symbolTable,"AllMemoryBarrier",EOpMemoryBarrier);
  TSymbolTable::relateToOperator
            (symbolTable,"AllMemoryBarrierWithGroupSync",EOpAllMemoryBarrierWithGroupSync);
  TSymbolTable::relateToOperator(symbolTable,"any",EOpAny);
  TSymbolTable::relateToOperator(symbolTable,"asdouble",EOpAsDouble);
  TSymbolTable::relateToOperator(symbolTable,"asfloat",EOpIntBitsToFloat);
  TSymbolTable::relateToOperator(symbolTable,"asin",EOpAsin);
  TSymbolTable::relateToOperator(symbolTable,"asint",EOpFloatBitsToInt);
  TSymbolTable::relateToOperator(symbolTable,"asuint",EOpFloatBitsToUint);
  TSymbolTable::relateToOperator(symbolTable,"atan",EOpAtan);
  TSymbolTable::relateToOperator(symbolTable,"atan2",EOpAtan);
  TSymbolTable::relateToOperator(symbolTable,"ceil",EOpCeil);
  TSymbolTable::relateToOperator(symbolTable,"clamp",EOpClamp);
  TSymbolTable::relateToOperator(symbolTable,"clip",EOpClip);
  TSymbolTable::relateToOperator(symbolTable,"cos",EOpCos);
  TSymbolTable::relateToOperator(symbolTable,"cosh",EOpCosh);
  TSymbolTable::relateToOperator(symbolTable,"countbits",EOpBitCount);
  TSymbolTable::relateToOperator(symbolTable,"cross",EOpCross);
  TSymbolTable::relateToOperator(symbolTable,"D3DCOLORtoUBYTE4",EOpD3DCOLORtoUBYTE4);
  TSymbolTable::relateToOperator(symbolTable,"ddx",EOpDPdx);
  TSymbolTable::relateToOperator(symbolTable,"ddx_coarse",EOpDPdxCoarse);
  TSymbolTable::relateToOperator(symbolTable,"ddx_fine",EOpDPdxFine);
  TSymbolTable::relateToOperator(symbolTable,"ddy",EOpDPdy);
  TSymbolTable::relateToOperator(symbolTable,"ddy_coarse",EOpDPdyCoarse);
  TSymbolTable::relateToOperator(symbolTable,"ddy_fine",EOpDPdyFine);
  TSymbolTable::relateToOperator(symbolTable,"degrees",EOpDegrees);
  TSymbolTable::relateToOperator(symbolTable,"determinant",EOpDeterminant);
  TSymbolTable::relateToOperator(symbolTable,"DeviceMemoryBarrier",EOpDeviceMemoryBarrier);
  TSymbolTable::relateToOperator
            (symbolTable,"DeviceMemoryBarrierWithGroupSync",EOpDeviceMemoryBarrierWithGroupSync);
  TSymbolTable::relateToOperator(symbolTable,"distance",EOpDistance);
  TSymbolTable::relateToOperator(symbolTable,"dot",EOpDot);
  TSymbolTable::relateToOperator(symbolTable,"dst",EOpDst);
  TSymbolTable::relateToOperator(symbolTable,"EvaluateAttributeAtCentroid",EOpInterpolateAtCentroid)
  ;
  TSymbolTable::relateToOperator(symbolTable,"EvaluateAttributeAtSample",EOpInterpolateAtSample);
  TSymbolTable::relateToOperator(symbolTable,"EvaluateAttributeSnapped",EOpEvaluateAttributeSnapped)
  ;
  TSymbolTable::relateToOperator(symbolTable,"exp",EOpExp);
  TSymbolTable::relateToOperator(symbolTable,"exp2",EOpExp2);
  TSymbolTable::relateToOperator(symbolTable,"f16tof32",EOpF16tof32);
  TSymbolTable::relateToOperator(symbolTable,"f32tof16",EOpF32tof16);
  TSymbolTable::relateToOperator(symbolTable,"faceforward",EOpFaceForward);
  TSymbolTable::relateToOperator(symbolTable,"firstbithigh",EOpFindMSB);
  TSymbolTable::relateToOperator(symbolTable,"firstbitlow",EOpFindLSB);
  TSymbolTable::relateToOperator(symbolTable,"floor",EOpFloor);
  TSymbolTable::relateToOperator(symbolTable,"fma",EOpFma);
  TSymbolTable::relateToOperator(symbolTable,"fmod",EOpMod);
  TSymbolTable::relateToOperator(symbolTable,"frac",EOpFract);
  TSymbolTable::relateToOperator(symbolTable,"frexp",EOpFrexp);
  TSymbolTable::relateToOperator(symbolTable,"fwidth",EOpFwidth);
  TSymbolTable::relateToOperator(symbolTable,"GroupMemoryBarrier",EOpWorkgroupMemoryBarrier);
  TSymbolTable::relateToOperator
            (symbolTable,"GroupMemoryBarrierWithGroupSync",EOpWorkgroupMemoryBarrierWithGroupSync);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedAdd",EOpInterlockedAdd);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedAnd",EOpInterlockedAnd);
  TSymbolTable::relateToOperator
            (symbolTable,"InterlockedCompareExchange",EOpInterlockedCompareExchange);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedCompareStore",EOpInterlockedCompareStore);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedExchange",EOpInterlockedExchange);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedMax",EOpInterlockedMax);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedMin",EOpInterlockedMin);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedOr",EOpInterlockedOr);
  TSymbolTable::relateToOperator(symbolTable,"InterlockedXor",EOpInterlockedXor);
  TSymbolTable::relateToOperator(symbolTable,"isfinite",EOpIsFinite);
  TSymbolTable::relateToOperator(symbolTable,"isinf",EOpIsInf);
  TSymbolTable::relateToOperator(symbolTable,"isnan",EOpIsNan);
  TSymbolTable::relateToOperator(symbolTable,"ldexp",EOpLdexp);
  TSymbolTable::relateToOperator(symbolTable,"length",EOpLength);
  TSymbolTable::relateToOperator(symbolTable,"lerp",EOpMix);
  TSymbolTable::relateToOperator(symbolTable,"lit",EOpLit);
  TSymbolTable::relateToOperator(symbolTable,"log",EOpLog);
  TSymbolTable::relateToOperator(symbolTable,"log10",EOpLog10);
  TSymbolTable::relateToOperator(symbolTable,"log2",EOpLog2);
  TSymbolTable::relateToOperator(symbolTable,"mad",EOpFma);
  TSymbolTable::relateToOperator(symbolTable,"max",EOpMax);
  TSymbolTable::relateToOperator(symbolTable,"min",EOpMin);
  TSymbolTable::relateToOperator(symbolTable,"modf",EOpModf);
  TSymbolTable::relateToOperator(symbolTable,"mul",EOpGenMul);
  TSymbolTable::relateToOperator(symbolTable,"normalize",EOpNormalize);
  TSymbolTable::relateToOperator(symbolTable,"pow",EOpPow);
  TSymbolTable::relateToOperator(symbolTable,"printf",EOpDebugPrintf);
  TSymbolTable::relateToOperator(symbolTable,"radians",EOpRadians);
  TSymbolTable::relateToOperator(symbolTable,"rcp",EOpRcp);
  TSymbolTable::relateToOperator(symbolTable,"reflect",EOpReflect);
  TSymbolTable::relateToOperator(symbolTable,"refract",EOpRefract);
  TSymbolTable::relateToOperator(symbolTable,"reversebits",EOpBitFieldReverse);
  TSymbolTable::relateToOperator(symbolTable,"round",EOpRound);
  TSymbolTable::relateToOperator(symbolTable,"rsqrt",EOpInverseSqrt);
  TSymbolTable::relateToOperator(symbolTable,"saturate",EOpSaturate);
  TSymbolTable::relateToOperator(symbolTable,"sign",EOpSign);
  TSymbolTable::relateToOperator(symbolTable,"sin",EOpSin);
  TSymbolTable::relateToOperator(symbolTable,"sincos",EOpSinCos);
  TSymbolTable::relateToOperator(symbolTable,"sinh",EOpSinh);
  TSymbolTable::relateToOperator(symbolTable,"smoothstep",EOpSmoothStep);
  TSymbolTable::relateToOperator(symbolTable,"sqrt",EOpSqrt);
  TSymbolTable::relateToOperator(symbolTable,"step",EOpStep);
  TSymbolTable::relateToOperator(symbolTable,"tan",EOpTan);
  TSymbolTable::relateToOperator(symbolTable,"tanh",EOpTanh);
  TSymbolTable::relateToOperator(symbolTable,"tex1D",EOpTexture);
  TSymbolTable::relateToOperator(symbolTable,"tex1Dbias",EOpTextureBias);
  TSymbolTable::relateToOperator(symbolTable,"tex1Dgrad",EOpTextureGrad);
  TSymbolTable::relateToOperator(symbolTable,"tex1Dlod",EOpTextureLod);
  TSymbolTable::relateToOperator(symbolTable,"tex1Dproj",EOpTextureProj);
  TSymbolTable::relateToOperator(symbolTable,"tex2D",EOpTexture);
  TSymbolTable::relateToOperator(symbolTable,"tex2Dbias",EOpTextureBias);
  TSymbolTable::relateToOperator(symbolTable,"tex2Dgrad",EOpTextureGrad);
  TSymbolTable::relateToOperator(symbolTable,"tex2Dlod",EOpTextureLod);
  TSymbolTable::relateToOperator(symbolTable,"tex2Dproj",EOpTextureProj);
  TSymbolTable::relateToOperator(symbolTable,"tex3D",EOpTexture);
  TSymbolTable::relateToOperator(symbolTable,"tex3Dbias",EOpTextureBias);
  TSymbolTable::relateToOperator(symbolTable,"tex3Dgrad",EOpTextureGrad);
  TSymbolTable::relateToOperator(symbolTable,"tex3Dlod",EOpTextureLod);
  TSymbolTable::relateToOperator(symbolTable,"tex3Dproj",EOpTextureProj);
  TSymbolTable::relateToOperator(symbolTable,"texCUBE",EOpTexture);
  TSymbolTable::relateToOperator(symbolTable,"texCUBEbias",EOpTextureBias);
  TSymbolTable::relateToOperator(symbolTable,"texCUBEgrad",EOpTextureGrad);
  TSymbolTable::relateToOperator(symbolTable,"texCUBElod",EOpTextureLod);
  TSymbolTable::relateToOperator(symbolTable,"texCUBEproj",EOpTextureProj);
  TSymbolTable::relateToOperator(symbolTable,"transpose",EOpTranspose);
  TSymbolTable::relateToOperator(symbolTable,"trunc",EOpTrunc);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Sample",EOpMethodSample);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SampleBias",EOpMethodSampleBias);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SampleCmp",EOpMethodSampleCmp);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SampleCmpLevelZero",EOpMethodSampleCmpLevelZero);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SampleGrad",EOpMethodSampleGrad);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SampleLevel",EOpMethodSampleLevel);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Load",EOpMethodLoad);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GetDimensions",EOpMethodGetDimensions);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GetSamplePosition",EOpMethodGetSamplePosition);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Gather",EOpMethodGather);
  TSymbolTable::relateToOperator
            (symbolTable,"__BI_CalculateLevelOfDetail",EOpMethodCalculateLevelOfDetail);
  TSymbolTable::relateToOperator
            (symbolTable,"__BI_CalculateLevelOfDetailUnclamped",
             EOpMethodCalculateLevelOfDetailUnclamped);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Load2",EOpMethodLoad2);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Load3",EOpMethodLoad3);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Load4",EOpMethodLoad4);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Store",EOpMethodStore);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Store2",EOpMethodStore2);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Store3",EOpMethodStore3);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Store4",EOpMethodStore4);
  TSymbolTable::relateToOperator(symbolTable,"__BI_IncrementCounter",EOpMethodIncrementCounter);
  TSymbolTable::relateToOperator(symbolTable,"__BI_DecrementCounter",EOpMethodDecrementCounter);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Consume",EOpMethodConsume);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedAdd",EOpInterlockedAdd);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedAnd",EOpInterlockedAnd);
  TSymbolTable::relateToOperator
            (symbolTable,"__BI_InterlockedCompareExchange",EOpInterlockedCompareExchange);
  TSymbolTable::relateToOperator
            (symbolTable,"__BI_InterlockedCompareStore",EOpInterlockedCompareStore);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedExchange",EOpInterlockedExchange);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedMax",EOpInterlockedMax);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedMin",EOpInterlockedMin);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedOr",EOpInterlockedOr);
  TSymbolTable::relateToOperator(symbolTable,"__BI_InterlockedXor",EOpInterlockedXor);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherRed",EOpMethodGatherRed);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherGreen",EOpMethodGatherGreen);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherBlue",EOpMethodGatherBlue);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherAlpha",EOpMethodGatherAlpha);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherCmp",EOpMethodGatherCmpRed);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherCmpRed",EOpMethodGatherCmpRed);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherCmpGreen",EOpMethodGatherCmpGreen);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherCmpBlue",EOpMethodGatherCmpBlue);
  TSymbolTable::relateToOperator(symbolTable,"__BI_GatherCmpAlpha",EOpMethodGatherCmpAlpha);
  TSymbolTable::relateToOperator(symbolTable,"__BI_Append",EOpMethodAppend);
  TSymbolTable::relateToOperator(symbolTable,"__BI_RestartStrip",EOpMethodRestartStrip);
  TSymbolTable::relateToOperator(symbolTable,"WaveIsFirstLane",EOpSubgroupElect);
  TSymbolTable::relateToOperator(symbolTable,"WaveGetLaneCount",EOpWaveGetLaneCount);
  TSymbolTable::relateToOperator(symbolTable,"WaveGetLaneIndex",EOpWaveGetLaneIndex);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveAnyTrue",EOpSubgroupAny);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveAllTrue",EOpSubgroupAll);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveBallot",EOpSubgroupBallot);
  TSymbolTable::relateToOperator(symbolTable,"WaveReadLaneFirst",EOpSubgroupBroadcastFirst);
  TSymbolTable::relateToOperator(symbolTable,"WaveReadLaneAt",EOpSubgroupShuffle);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveAllEqual",EOpSubgroupAllEqual);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveAllEqualBool",EOpSubgroupAllEqual);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveCountBits",EOpWaveActiveCountBits);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveSum",EOpSubgroupAdd);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveProduct",EOpSubgroupMul);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveBitAnd",EOpSubgroupAnd);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveBitOr",EOpSubgroupOr);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveBitXor",EOpSubgroupXor);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveMin",EOpSubgroupMin);
  TSymbolTable::relateToOperator(symbolTable,"WaveActiveMax",EOpSubgroupMax);
  TSymbolTable::relateToOperator(symbolTable,"WavePrefixSum",EOpSubgroupInclusiveAdd);
  TSymbolTable::relateToOperator(symbolTable,"WavePrefixProduct",EOpSubgroupInclusiveMul);
  TSymbolTable::relateToOperator(symbolTable,"WavePrefixCountBits",EOpWavePrefixCountBits);
  TSymbolTable::relateToOperator(symbolTable,"QuadReadAcrossX",EOpSubgroupQuadSwapHorizontal);
  TSymbolTable::relateToOperator(symbolTable,"QuadReadAcrossY",EOpSubgroupQuadSwapVertical);
  TSymbolTable::relateToOperator(symbolTable,"QuadReadAcrossDiagonal",EOpSubgroupQuadSwapDiagonal);
  TSymbolTable::relateToOperator(symbolTable,"QuadReadLaneAt",EOpSubgroupQuadBroadcast);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SubpassLoad",EOpSubpassLoad);
  TSymbolTable::relateToOperator(symbolTable,"__BI_SubpassLoadMS",EOpSubpassLoadMS);
  return;
}

Assistant:

void TBuiltInParseablesHlsl::identifyBuiltIns(int /*version*/, EProfile /*profile*/, const SpvVersion& /*spvVersion*/, EShLanguage /*language*/,
                                              TSymbolTable& symbolTable)
{
    // symbolTable.relateToOperator("abort",                       EOpAbort);
    symbolTable.relateToOperator("abs",                         EOpAbs);
    symbolTable.relateToOperator("acos",                        EOpAcos);
    symbolTable.relateToOperator("all",                         EOpAll);
    symbolTable.relateToOperator("AllMemoryBarrier",            EOpMemoryBarrier);
    symbolTable.relateToOperator("AllMemoryBarrierWithGroupSync", EOpAllMemoryBarrierWithGroupSync);
    symbolTable.relateToOperator("any",                         EOpAny);
    symbolTable.relateToOperator("asdouble",                    EOpAsDouble);
    symbolTable.relateToOperator("asfloat",                     EOpIntBitsToFloat);
    symbolTable.relateToOperator("asin",                        EOpAsin);
    symbolTable.relateToOperator("asint",                       EOpFloatBitsToInt);
    symbolTable.relateToOperator("asuint",                      EOpFloatBitsToUint);
    symbolTable.relateToOperator("atan",                        EOpAtan);
    symbolTable.relateToOperator("atan2",                       EOpAtan);
    symbolTable.relateToOperator("ceil",                        EOpCeil);
    // symbolTable.relateToOperator("CheckAccessFullyMapped");
    symbolTable.relateToOperator("clamp",                       EOpClamp);
    symbolTable.relateToOperator("clip",                        EOpClip);
    symbolTable.relateToOperator("cos",                         EOpCos);
    symbolTable.relateToOperator("cosh",                        EOpCosh);
    symbolTable.relateToOperator("countbits",                   EOpBitCount);
    symbolTable.relateToOperator("cross",                       EOpCross);
    symbolTable.relateToOperator("D3DCOLORtoUBYTE4",            EOpD3DCOLORtoUBYTE4);
    symbolTable.relateToOperator("ddx",                         EOpDPdx);
    symbolTable.relateToOperator("ddx_coarse",                  EOpDPdxCoarse);
    symbolTable.relateToOperator("ddx_fine",                    EOpDPdxFine);
    symbolTable.relateToOperator("ddy",                         EOpDPdy);
    symbolTable.relateToOperator("ddy_coarse",                  EOpDPdyCoarse);
    symbolTable.relateToOperator("ddy_fine",                    EOpDPdyFine);
    symbolTable.relateToOperator("degrees",                     EOpDegrees);
    symbolTable.relateToOperator("determinant",                 EOpDeterminant);
    symbolTable.relateToOperator("DeviceMemoryBarrier",         EOpDeviceMemoryBarrier);
    symbolTable.relateToOperator("DeviceMemoryBarrierWithGroupSync", EOpDeviceMemoryBarrierWithGroupSync);
    symbolTable.relateToOperator("distance",                    EOpDistance);
    symbolTable.relateToOperator("dot",                         EOpDot);
    symbolTable.relateToOperator("dst",                         EOpDst);
    // symbolTable.relateToOperator("errorf",                      EOpErrorf);
    symbolTable.relateToOperator("EvaluateAttributeAtCentroid", EOpInterpolateAtCentroid);
    symbolTable.relateToOperator("EvaluateAttributeAtSample",   EOpInterpolateAtSample);
    symbolTable.relateToOperator("EvaluateAttributeSnapped",    EOpEvaluateAttributeSnapped);
    symbolTable.relateToOperator("exp",                         EOpExp);
    symbolTable.relateToOperator("exp2",                        EOpExp2);
    symbolTable.relateToOperator("f16tof32",                    EOpF16tof32);
    symbolTable.relateToOperator("f32tof16",                    EOpF32tof16);
    symbolTable.relateToOperator("faceforward",                 EOpFaceForward);
    symbolTable.relateToOperator("firstbithigh",                EOpFindMSB);
    symbolTable.relateToOperator("firstbitlow",                 EOpFindLSB);
    symbolTable.relateToOperator("floor",                       EOpFloor);
    symbolTable.relateToOperator("fma",                         EOpFma);
    symbolTable.relateToOperator("fmod",                        EOpMod);
    symbolTable.relateToOperator("frac",                        EOpFract);
    symbolTable.relateToOperator("frexp",                       EOpFrexp);
    symbolTable.relateToOperator("fwidth",                      EOpFwidth);
    // symbolTable.relateToOperator("GetRenderTargetSampleCount");
    // symbolTable.relateToOperator("GetRenderTargetSamplePosition");
    symbolTable.relateToOperator("GroupMemoryBarrier",          EOpWorkgroupMemoryBarrier);
    symbolTable.relateToOperator("GroupMemoryBarrierWithGroupSync", EOpWorkgroupMemoryBarrierWithGroupSync);
    symbolTable.relateToOperator("InterlockedAdd",              EOpInterlockedAdd);
    symbolTable.relateToOperator("InterlockedAnd",              EOpInterlockedAnd);
    symbolTable.relateToOperator("InterlockedCompareExchange",  EOpInterlockedCompareExchange);
    symbolTable.relateToOperator("InterlockedCompareStore",     EOpInterlockedCompareStore);
    symbolTable.relateToOperator("InterlockedExchange",         EOpInterlockedExchange);
    symbolTable.relateToOperator("InterlockedMax",              EOpInterlockedMax);
    symbolTable.relateToOperator("InterlockedMin",              EOpInterlockedMin);
    symbolTable.relateToOperator("InterlockedOr",               EOpInterlockedOr);
    symbolTable.relateToOperator("InterlockedXor",              EOpInterlockedXor);
    symbolTable.relateToOperator("isfinite",                    EOpIsFinite);
    symbolTable.relateToOperator("isinf",                       EOpIsInf);
    symbolTable.relateToOperator("isnan",                       EOpIsNan);
    symbolTable.relateToOperator("ldexp",                       EOpLdexp);
    symbolTable.relateToOperator("length",                      EOpLength);
    symbolTable.relateToOperator("lerp",                        EOpMix);
    symbolTable.relateToOperator("lit",                         EOpLit);
    symbolTable.relateToOperator("log",                         EOpLog);
    symbolTable.relateToOperator("log10",                       EOpLog10);
    symbolTable.relateToOperator("log2",                        EOpLog2);
    symbolTable.relateToOperator("mad",                         EOpFma);
    symbolTable.relateToOperator("max",                         EOpMax);
    symbolTable.relateToOperator("min",                         EOpMin);
    symbolTable.relateToOperator("modf",                        EOpModf);
    // symbolTable.relateToOperator("msad4",                       EOpMsad4);
    symbolTable.relateToOperator("mul",                         EOpGenMul);
    // symbolTable.relateToOperator("noise",                    EOpNoise); // TODO: check return type
    symbolTable.relateToOperator("normalize",                   EOpNormalize);
    symbolTable.relateToOperator("pow",                         EOpPow);
    symbolTable.relateToOperator("printf",                      EOpDebugPrintf);
    // symbolTable.relateToOperator("Process2DQuadTessFactorsAvg");
    // symbolTable.relateToOperator("Process2DQuadTessFactorsMax");
    // symbolTable.relateToOperator("Process2DQuadTessFactorsMin");
    // symbolTable.relateToOperator("ProcessIsolineTessFactors");
    // symbolTable.relateToOperator("ProcessQuadTessFactorsAvg");
    // symbolTable.relateToOperator("ProcessQuadTessFactorsMax");
    // symbolTable.relateToOperator("ProcessQuadTessFactorsMin");
    // symbolTable.relateToOperator("ProcessTriTessFactorsAvg");
    // symbolTable.relateToOperator("ProcessTriTessFactorsMax");
    // symbolTable.relateToOperator("ProcessTriTessFactorsMin");
    symbolTable.relateToOperator("radians",                     EOpRadians);
    symbolTable.relateToOperator("rcp",                         EOpRcp);
    symbolTable.relateToOperator("reflect",                     EOpReflect);
    symbolTable.relateToOperator("refract",                     EOpRefract);
    symbolTable.relateToOperator("reversebits",                 EOpBitFieldReverse);
    symbolTable.relateToOperator("round",                       EOpRound);
    symbolTable.relateToOperator("rsqrt",                       EOpInverseSqrt);
    symbolTable.relateToOperator("saturate",                    EOpSaturate);
    symbolTable.relateToOperator("sign",                        EOpSign);
    symbolTable.relateToOperator("sin",                         EOpSin);
    symbolTable.relateToOperator("sincos",                      EOpSinCos);
    symbolTable.relateToOperator("sinh",                        EOpSinh);
    symbolTable.relateToOperator("smoothstep",                  EOpSmoothStep);
    symbolTable.relateToOperator("sqrt",                        EOpSqrt);
    symbolTable.relateToOperator("step",                        EOpStep);
    symbolTable.relateToOperator("tan",                         EOpTan);
    symbolTable.relateToOperator("tanh",                        EOpTanh);
    symbolTable.relateToOperator("tex1D",                       EOpTexture);
    symbolTable.relateToOperator("tex1Dbias",                   EOpTextureBias);
    symbolTable.relateToOperator("tex1Dgrad",                   EOpTextureGrad);
    symbolTable.relateToOperator("tex1Dlod",                    EOpTextureLod);
    symbolTable.relateToOperator("tex1Dproj",                   EOpTextureProj);
    symbolTable.relateToOperator("tex2D",                       EOpTexture);
    symbolTable.relateToOperator("tex2Dbias",                   EOpTextureBias);
    symbolTable.relateToOperator("tex2Dgrad",                   EOpTextureGrad);
    symbolTable.relateToOperator("tex2Dlod",                    EOpTextureLod);
    symbolTable.relateToOperator("tex2Dproj",                   EOpTextureProj);
    symbolTable.relateToOperator("tex3D",                       EOpTexture);
    symbolTable.relateToOperator("tex3Dbias",                   EOpTextureBias);
    symbolTable.relateToOperator("tex3Dgrad",                   EOpTextureGrad);
    symbolTable.relateToOperator("tex3Dlod",                    EOpTextureLod);
    symbolTable.relateToOperator("tex3Dproj",                   EOpTextureProj);
    symbolTable.relateToOperator("texCUBE",                     EOpTexture);
    symbolTable.relateToOperator("texCUBEbias",                 EOpTextureBias);
    symbolTable.relateToOperator("texCUBEgrad",                 EOpTextureGrad);
    symbolTable.relateToOperator("texCUBElod",                  EOpTextureLod);
    symbolTable.relateToOperator("texCUBEproj",                 EOpTextureProj);
    symbolTable.relateToOperator("transpose",                   EOpTranspose);
    symbolTable.relateToOperator("trunc",                       EOpTrunc);

    // Texture methods
    symbolTable.relateToOperator(BUILTIN_PREFIX "Sample",                      EOpMethodSample);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SampleBias",                  EOpMethodSampleBias);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SampleCmp",                   EOpMethodSampleCmp);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SampleCmpLevelZero",          EOpMethodSampleCmpLevelZero);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SampleGrad",                  EOpMethodSampleGrad);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SampleLevel",                 EOpMethodSampleLevel);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Load",                        EOpMethodLoad);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GetDimensions",               EOpMethodGetDimensions);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GetSamplePosition",           EOpMethodGetSamplePosition);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Gather",                      EOpMethodGather);
    symbolTable.relateToOperator(BUILTIN_PREFIX "CalculateLevelOfDetail",      EOpMethodCalculateLevelOfDetail);
    symbolTable.relateToOperator(BUILTIN_PREFIX "CalculateLevelOfDetailUnclamped", EOpMethodCalculateLevelOfDetailUnclamped);

    // Structure buffer methods (excluding associations already made above for texture methods w/ same name)
    symbolTable.relateToOperator(BUILTIN_PREFIX "Load2",                       EOpMethodLoad2);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Load3",                       EOpMethodLoad3);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Load4",                       EOpMethodLoad4);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Store",                       EOpMethodStore);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Store2",                      EOpMethodStore2);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Store3",                      EOpMethodStore3);
    symbolTable.relateToOperator(BUILTIN_PREFIX "Store4",                      EOpMethodStore4);
    symbolTable.relateToOperator(BUILTIN_PREFIX "IncrementCounter",            EOpMethodIncrementCounter);
    symbolTable.relateToOperator(BUILTIN_PREFIX "DecrementCounter",            EOpMethodDecrementCounter);
    // Append is also a GS method: we don't add it twice
    symbolTable.relateToOperator(BUILTIN_PREFIX "Consume",                     EOpMethodConsume);

    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedAdd",              EOpInterlockedAdd);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedAnd",              EOpInterlockedAnd);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedCompareExchange",  EOpInterlockedCompareExchange);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedCompareStore",     EOpInterlockedCompareStore);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedExchange",         EOpInterlockedExchange);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedMax",              EOpInterlockedMax);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedMin",              EOpInterlockedMin);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedOr",               EOpInterlockedOr);
    symbolTable.relateToOperator(BUILTIN_PREFIX "InterlockedXor",              EOpInterlockedXor);

    // SM5 Texture methods
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherRed",                   EOpMethodGatherRed);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherGreen",                 EOpMethodGatherGreen);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherBlue",                  EOpMethodGatherBlue);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherAlpha",                 EOpMethodGatherAlpha);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherCmp",                   EOpMethodGatherCmpRed); // alias
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherCmpRed",                EOpMethodGatherCmpRed);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherCmpGreen",              EOpMethodGatherCmpGreen);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherCmpBlue",               EOpMethodGatherCmpBlue);
    symbolTable.relateToOperator(BUILTIN_PREFIX "GatherCmpAlpha",              EOpMethodGatherCmpAlpha);

    // GS methods
    symbolTable.relateToOperator(BUILTIN_PREFIX "Append",                      EOpMethodAppend);
    symbolTable.relateToOperator(BUILTIN_PREFIX "RestartStrip",                EOpMethodRestartStrip);

    // Wave ops
    symbolTable.relateToOperator("WaveIsFirstLane",                            EOpSubgroupElect);
    symbolTable.relateToOperator("WaveGetLaneCount",                           EOpWaveGetLaneCount);
    symbolTable.relateToOperator("WaveGetLaneIndex",                           EOpWaveGetLaneIndex);
    symbolTable.relateToOperator("WaveActiveAnyTrue",                          EOpSubgroupAny);
    symbolTable.relateToOperator("WaveActiveAllTrue",                          EOpSubgroupAll);
    symbolTable.relateToOperator("WaveActiveBallot",                           EOpSubgroupBallot);
    symbolTable.relateToOperator("WaveReadLaneFirst",                          EOpSubgroupBroadcastFirst);
    symbolTable.relateToOperator("WaveReadLaneAt",                             EOpSubgroupShuffle);
    symbolTable.relateToOperator("WaveActiveAllEqual",                         EOpSubgroupAllEqual);
    symbolTable.relateToOperator("WaveActiveAllEqualBool",                     EOpSubgroupAllEqual);
    symbolTable.relateToOperator("WaveActiveCountBits",                        EOpWaveActiveCountBits);
    symbolTable.relateToOperator("WaveActiveSum",                              EOpSubgroupAdd);
    symbolTable.relateToOperator("WaveActiveProduct",                          EOpSubgroupMul);
    symbolTable.relateToOperator("WaveActiveBitAnd",                           EOpSubgroupAnd);
    symbolTable.relateToOperator("WaveActiveBitOr",                            EOpSubgroupOr);
    symbolTable.relateToOperator("WaveActiveBitXor",                           EOpSubgroupXor);
    symbolTable.relateToOperator("WaveActiveMin",                              EOpSubgroupMin);
    symbolTable.relateToOperator("WaveActiveMax",                              EOpSubgroupMax);
    symbolTable.relateToOperator("WavePrefixSum",                              EOpSubgroupInclusiveAdd);
    symbolTable.relateToOperator("WavePrefixProduct",                          EOpSubgroupInclusiveMul);
    symbolTable.relateToOperator("WavePrefixCountBits",                        EOpWavePrefixCountBits);
    symbolTable.relateToOperator("QuadReadAcrossX",                            EOpSubgroupQuadSwapHorizontal);
    symbolTable.relateToOperator("QuadReadAcrossY",                            EOpSubgroupQuadSwapVertical);
    symbolTable.relateToOperator("QuadReadAcrossDiagonal",                     EOpSubgroupQuadSwapDiagonal);
    symbolTable.relateToOperator("QuadReadLaneAt",                             EOpSubgroupQuadBroadcast);

    // Subpass input methods
    symbolTable.relateToOperator(BUILTIN_PREFIX "SubpassLoad",                 EOpSubpassLoad);
    symbolTable.relateToOperator(BUILTIN_PREFIX "SubpassLoadMS",               EOpSubpassLoadMS);
}